

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,UniformBlock *blk)

{
  QDebug *pQVar1;
  long in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QDebug *in_stack_ffffffffffffffa0;
  QByteArray *in_stack_ffffffffffffffa8;
  QDebug *this;
  Stream *this_00;
  QDebug local_20;
  QDebug in_stack_ffffffffffffffe8;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffe8.stream);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffffa8);
  QDebug::operator<<(in_stack_ffffffffffffffa0,(char)((uint)in_stack_ffffffffffffff9c >> 0x18));
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffffa8);
  QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffe8.stream);
  QDebug::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if (-1 < *(int *)(in_RDX + 0x34)) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffe8.stream);
    QDebug::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  if (-1 < *(int *)(in_RDX + 0x38)) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffe8.stream);
    QDebug::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffffa0,
                              (char)((uint)in_stack_ffffffffffffff9c >> 0x18));
  this = &local_20;
  QDebug::QDebug(this,pQVar1);
  pQVar1 = (QDebug *)&stack0xffffffffffffffe8;
  operator<<((QDebug *)this_00,(QList<QShaderDescription::BlockVariable> *)in_RDI);
  QDebug::operator<<(pQVar1,(char)((uint)in_stack_ffffffffffffff9c >> 0x18));
  QDebug::~QDebug(pQVar1);
  QDebug::~QDebug(this);
  QDebug::QDebug(pQVar1,(QDebug *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QShaderDescription::UniformBlock &blk)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "UniformBlock(" << blk.blockName << ' ' << blk.structName
                  << " size=" << blk.size;
    if (blk.binding >= 0)
        dbg.nospace() << " binding=" << blk.binding;
    if (blk.descriptorSet >= 0)
        dbg.nospace() << " set=" << blk.descriptorSet;
    dbg.nospace() << ' ' << blk.members << ')';
    return dbg;
}